

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  LogFinisher local_81;
  long local_80;
  ulong local_78;
  ulong local_70;
  LogMessage local_68;
  
  uVar4 = (ulong)num;
  uVar6 = (ulong)start;
  local_80 = elements;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x578);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_81,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x579);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_81,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  lVar5 = local_80;
  if ((this->super_RepeatedPtrFieldBase).current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x57a);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_81,pLVar1);
    lVar5 = local_80;
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num != 0) {
    local_78 = uVar6;
    local_70 = uVar4;
    if (lVar5 == 0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x57e);
      pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (elements) != (nullptr): ")
      ;
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,
                          "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                         );
      internal::LogFinisher::operator=(&local_81,pLVar1);
      internal::LogMessage::~LogMessage(&local_68);
    }
    else if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
      if (0 < (int)num) {
        uVar6 = 0;
        do {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,start + (int)uVar6);
          *(Type **)(lVar5 + uVar6 * 8) = pTVar3;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
    }
    else if (0 < (int)num) {
      uVar6 = 0;
      do {
        internal::RepeatedPtrFieldBase::
        Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&this->super_RepeatedPtrFieldBase,start + (int)uVar6);
        psVar2 = (string *)operator_new(0x20);
        *(string **)psVar2 = psVar2 + 0x10;
        *(undefined8 *)(psVar2 + 8) = 0;
        psVar2[0x10] = (string)0x0;
        std::__cxx11::string::_M_assign(psVar2);
        *(string **)(local_80 + uVar6 * 8) = psVar2;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    internal::RepeatedPtrFieldBase::CloseGap
              (&this->super_RepeatedPtrFieldBase,(int)local_78,(int)local_70);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num == 0) return;

  GOOGLE_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements == nullptr) {
    CloseGap(start, num);
    return;
  }

  Arena* arena = GetArena();
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  // Always copy.
  for (int i = 0; i < num; ++i) {
    elements[i] = copy<TypeHandler>(
        RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
  }
  if (arena == nullptr) {
    for (int i = 0; i < num; ++i) {
      delete RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#else   // PROTOBUF_FORCE_COPY_IN_RELEASE
  // If we're on an arena, we perform a copy for each element so that the
  // returned elements are heap-allocated. Otherwise, just forward it.
  if (arena != nullptr) {
    for (int i = 0; i < num; ++i) {
      elements[i] = copy<TypeHandler>(
          RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start));
    }
  } else {
    for (int i = 0; i < num; ++i) {
      elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
    }
  }
#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE
  CloseGap(start, num);
}